

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  iterator __pos;
  CZString key;
  Value local_1b8;
  value_type defaultValue;
  
  if (this->field_0x8 == '\0') {
LAB_00125800:
    Value(&local_1b8,arrayValue);
    swap(this,&local_1b8);
    ~Value(&local_1b8);
  }
  else if (this->field_0x8 != '\x06') {
    this = (Value *)&defaultValue;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"in Json::Value::operator[](ArrayIndex): requires arrayValue");
    std::__cxx11::stringbuf::str();
    throwLogicError((string *)&key);
    goto LAB_00125800;
  }
  key.cstr_ = (char *)0x0;
  key.field_1.index_ = index;
  __pos = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::lower_bound(&((ValueHolder *)&((value_type *)this)->first)->map_->_M_t,&key);
  if ((_Rb_tree_header *)__pos._M_node !=
      &(((ValueHolder *)&((value_type *)this)->first)->map_->_M_t)._M_impl.super__Rb_tree_header) {
    bVar1 = CZString::operator==((CZString *)(__pos._M_node + 1),&key);
    if (bVar1) goto LAB_00125888;
  }
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            (&defaultValue,&key,(Value *)kNull);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)((ValueHolder *)&((value_type *)this)->first)->map_,__pos._M_node,
                     &defaultValue);
  std::pair<const_Json::Value::CZString,_Json::Value>::~pair(&defaultValue);
LAB_00125888:
  CZString::~CZString(&key);
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  CZString key(index);
  ObjectValues::iterator it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, nullRef);
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
}